

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O2

SeatPromptResult *
console_confirm_weak_cached_hostkey
          (SeatPromptResult *__return_storage_ptr__,Seat *seat,char *algname,char *betteralgs,
          _func_void_void_ptr_SeatPromptResult *callback,void *ctx)

{
  size_t len;
  void *buf;
  termios cf;
  char line [32];
  termios newmode;
  termios oldmode;
  termios local_f4;
  byte local_b8 [32];
  termios local_98;
  termios local_5c;
  
  premsg(&local_f4);
  fprintf(_stderr,
          "The first host key type we have stored for this server\nis %s, which is below the configured warning threshold.\nThe server also provides the following types of host key\nabove the threshold, which we do not have stored:\n%s\n"
          ,algname,betteralgs);
  if (console_batch_mode == true) {
    fputs("Connection abandoned.\n",_stderr);
    postmsg(&local_f4);
    make_spr_sw_abort_static
              (__return_storage_ptr__,"Cannot confirm a weak cached host key in batch mode");
  }
  else {
    fputs("Continue with connection? (y/n) ",_stderr);
    fflush(_stderr);
    tcgetattr(0,&local_5c);
    local_98.c_iflag = local_5c.c_iflag;
    local_98.c_oflag = local_5c.c_oflag;
    local_98.c_line = local_5c.c_line;
    local_98.c_cc[0] = local_5c.c_cc[0];
    local_98.c_cc[1] = local_5c.c_cc[1];
    local_98.c_cc[2] = local_5c.c_cc[2];
    local_98.c_cc[3] = local_5c.c_cc[3];
    local_98.c_cc[4] = local_5c.c_cc[4];
    local_98.c_cc[5] = local_5c.c_cc[5];
    local_98.c_cc[6] = local_5c.c_cc[6];
    local_98.c_cc[7] = local_5c.c_cc[7];
    local_98.c_cc[8] = local_5c.c_cc[8];
    local_98.c_cc[9] = local_5c.c_cc[9];
    local_98.c_cc[10] = local_5c.c_cc[10];
    local_98.c_cc[0xb] = local_5c.c_cc[0xb];
    local_98.c_cc[0xc] = local_5c.c_cc[0xc];
    local_98.c_cc[0xd] = local_5c.c_cc[0xd];
    local_98.c_cc[0xe] = local_5c.c_cc[0xe];
    local_98.c_cc[0xf] = local_5c.c_cc[0xf];
    local_98.c_cc[0x10] = local_5c.c_cc[0x10];
    local_98.c_cc[0x11] = local_5c.c_cc[0x11];
    local_98.c_cc[0x12] = local_5c.c_cc[0x12];
    local_98.c_cc[0x13] = local_5c.c_cc[0x13];
    local_98.c_cc[0x14] = local_5c.c_cc[0x14];
    local_98.c_cc[0x15] = local_5c.c_cc[0x15];
    local_98.c_cc[0x16] = local_5c.c_cc[0x16];
    local_98.c_ispeed = local_5c.c_ispeed;
    local_98.c_ospeed = local_5c.c_ospeed;
    local_98._8_8_ = local_5c._8_8_ | 0xb00000000;
    buf = (void *)0x0;
    tcsetattr(0,0,&local_98);
    local_b8[0] = 0;
    block_and_read((wchar_t)local_b8,buf,len);
    tcsetattr(0,0,&local_5c);
    if ((local_b8[0] & 0xdf) == 0x59) {
      postmsg(&local_f4);
      __return_storage_ptr__->kind = SPRK_OK;
    }
    else {
      fputs("Connection abandoned.\n",_stderr);
      postmsg(&local_f4);
      __return_storage_ptr__->kind = SPRK_USER_ABORT;
    }
    __return_storage_ptr__->errdata_lit = (char *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult console_confirm_weak_cached_hostkey(
    Seat *seat, const char *algname, const char *betteralgs,
    void (*callback)(void *ctx, SeatPromptResult result), void *ctx)
{
    char line[32];
    struct termios cf;

    premsg(&cf);
    fprintf(stderr, weakhk_msg_common_fmt, algname, betteralgs);

    if (console_batch_mode) {
        fputs(console_abandoned_msg, stderr);
        postmsg(&cf);
        return SPR_SW_ABORT("Cannot confirm a weak cached host key "
                            "in batch mode");
    }

    fputs(console_continue_prompt, stderr);
    fflush(stderr);

    {
        struct termios oldmode, newmode;
        tcgetattr(0, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ECHO | ISIG | ICANON;
        tcsetattr(0, TCSANOW, &newmode);
        line[0] = '\0';
        if (block_and_read(0, line, sizeof(line) - 1) <= 0)
            /* handled below */;
        tcsetattr(0, TCSANOW, &oldmode);
    }

    if (line[0] == 'y' || line[0] == 'Y') {
        postmsg(&cf);
        return SPR_OK;
    } else {
        fputs(console_abandoned_msg, stderr);
        postmsg(&cf);
        return SPR_USER_ABORT;
    }
}